

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSession.cpp
# Opt level: O0

void __thiscall net_uv::KCPSession::executeSend(KCPSession *this,char *data,uint32_t len)

{
  bool bVar1;
  uint uVar2;
  uint32_t len_local;
  char *data_local;
  KCPSession *this_local;
  
  if ((data != (char *)0x0) && (len != 0)) {
    bVar1 = Session::isOnline(&this->super_Session);
    if ((bVar1) &&
       (uVar2 = (*(this->m_socket->super_Socket)._vptr_Socket[6])(this->m_socket,data,(ulong)len,0),
       (uVar2 & 1) == 0)) {
      (*(this->super_Session)._vptr_Session[9])();
    }
    free(data);
  }
  return;
}

Assistant:

void KCPSession::executeSend(char* data, uint32_t len)
{
	if (data == NULL || len <= 0)
		return;

	if (isOnline())
	{
		if (!m_socket->send(data, len, NULL, NULL))
		{
			executeDisconnect();
		}
	}
	fc_free(data);
}